

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_icu::calendar_impl::calendar_impl(calendar_impl *this,cdata *dat)

{
  Locale *in_RSI;
  abstract_calendar *in_RDI;
  UErrorCode *unaff_retaddr;
  UErrorCode err;
  string *this_00;
  UErrorCode local_20 [4];
  Locale *local_10;
  
  local_10 = in_RSI;
  abstract_calendar::abstract_calendar(in_RDI);
  in_RDI->_vptr_abstract_calendar = (_func_int **)&PTR_clone_002eacc0;
  std::mutex::mutex((mutex *)0x265379);
  this_00 = (string *)(in_RDI + 6);
  std::__cxx11::string::string(this_00);
  hold_ptr<icu_70::Calendar>::hold_ptr((hold_ptr<icu_70::Calendar> *)(in_RDI + 10));
  local_20[0] = U_ZERO_ERROR;
  icu_70::Calendar::createInstance(local_10,local_20);
  hold_ptr<icu_70::Calendar>::reset((hold_ptr<icu_70::Calendar> *)in_RDI,(Calendar *)this_00);
  check_and_throw_dt(unaff_retaddr);
  std::__cxx11::string::operator=((string *)(in_RDI + 6),(string *)(local_10 + 0xe0));
  return;
}

Assistant:

calendar_impl(cdata const &dat)
        {
            UErrorCode err=U_ZERO_ERROR;
            calendar_.reset(icu::Calendar::createInstance(dat.locale,err));
            check_and_throw_dt(err);
            #if U_ICU_VERSION_MAJOR_NUM*100 + U_ICU_VERSION_MINOR_NUM < 402
            // workaround old/invalid data, it should be 4 in general
            calendar_->setMinimalDaysInFirstWeek(4);
            #endif
            encoding_ = dat.encoding;
        }